

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::assertString(stringstream *stream,string *message)

{
  long lVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find((string *)&bStack_c8,(ulong)message);
  std::__cxx11::string::~string((string *)&bStack_c8);
  if (lVar1 != -1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,"ERROR!!: \'",message);
  std::operator+(&local_68,&local_88,"\' not found in \'");
  std::__cxx11::stringbuf::str();
  std::operator+(&local_48,&local_68,&local_a8);
  std::operator+(&bStack_c8,&local_48,"\'");
  std::runtime_error::runtime_error(this,(string *)&bStack_c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void assertString(std::stringstream & stream, const std::string & message)
{
    if (stream.str().find(message) == std::string::npos) {
        throw std::runtime_error("ERROR!!: '" + message + "' not found in '" + stream.str() + "'");
    }
}